

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

int tclpkcs11_list_objects(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  tclpkcs11_handle *handle;
  _func_Tcl_Obj_ptr_char_ptr_int *p_Var1;
  _func_void_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *__s1;
  Tcl_Obj *pTVar6;
  size_t sVar7;
  Tcl_Obj *pTVar8;
  Tcl_Obj *pTVar9;
  ProcErrorProc *pPVar10;
  CK_RV CVar11;
  CK_ULONG CVar12;
  CK_OBJECT_CLASS oclass;
  int local_1134;
  CK_OBJECT_HANDLE hObject;
  Tcl_Obj *local_1128;
  Tcl_Obj *local_1120;
  CK_ATTRIBUTE local_1118;
  Tcl_Obj *local_1100;
  CK_ATTRIBUTE attr_ckaid [1];
  CK_ATTRIBUTE attr_label [1];
  Tcl_Obj *local_10c0;
  CK_ULONG ulObjectCount;
  long slotid_long;
  CK_ATTRIBUTE attr_class [1];
  CK_ATTRIBUTE attr_find [1];
  CK_ATTRIBUTE attr_find_class [2];
  CK_BYTE ckaid [2048];
  CK_UTF8CHAR label [2048];
  
  attr_find_class[1].pValue = &oclass;
  oclass = 0;
  attr_find[0].ulValueLen = 1;
  attr_find[0].type = 1;
  attr_find[0].pValue = &tclpkcs11_list_objects::ltrue;
  attr_class[0].ulValueLen = 0;
  attr_class[0].type = 0;
  attr_class[0].pValue = (CK_VOID_PTR)0x0;
  attr_label[0].ulValueLen = 0;
  attr_label[0].type = 3;
  attr_label[0].pValue = (CK_VOID_PTR)0x0;
  attr_ckaid[0].ulValueLen = 0;
  attr_ckaid[0].type = 0x102;
  attr_ckaid[0].pValue = (CK_VOID_PTR)0x0;
  local_1118.ulValueLen = 0;
  CVar12 = 1;
  attr_find_class[0].type = 1;
  attr_find_class[0].pValue = &tclpkcs11_list_objects::ltrue;
  attr_find_class[0].ulValueLen = 1;
  attr_find_class[1].type = 0;
  local_1118.type = 0x11;
  local_1118.pValue = (uchar *)0x0;
  attr_find_class[1].ulValueLen = 8;
  if (cd == (ClientData)0x0) {
    pPVar10 = tclStubsPtr->tcl_SetObjResult;
    pcVar4 = "invalid clientdata";
  }
  else {
    pTVar6 = objv[1];
    pTVar8 = objv[2];
    local_1134 = objc;
    if (3 < objc) {
      pcVar4 = (*tclStubsPtr->tcl_GetString)(objv[3]);
      iVar3 = strcmp(pcVar4,"all");
      if (iVar3 == 0) {
        CVar12 = 1;
        local_1128 = (Tcl_Obj *)attr_find;
LAB_0010451e:
        if (local_1134 == 4) goto LAB_0010452d;
        local_1120 = pTVar8;
        __s1 = (*tclStubsPtr->tcl_GetString)(objv[4]);
        iVar3 = strcmp(__s1,"value");
        if (iVar3 != 0) goto LAB_00104602;
        iVar3 = strcmp(pcVar4,"privkey");
        pTVar8 = local_1120;
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar4,"all");
          if (iVar3 == 0) {
            pPVar10 = tclStubsPtr->tcl_SetObjResult;
            pcVar4 = "pki::pkcs11::listobjects: cannot value private key\"";
            goto LAB_001045ab;
          }
          goto LAB_0010452d;
        }
        pPVar10 = tclStubsPtr->tcl_SetObjResult;
        pcVar4 = "pki::pkcs11::listobjects: cannot value private key\"";
      }
      else {
        iVar3 = strcmp(pcVar4,"cert");
        CVar12 = 2;
        local_1128 = (Tcl_Obj *)attr_find_class;
        if (iVar3 == 0) {
          oclass = 1;
          goto LAB_0010451e;
        }
        iVar3 = strcmp(pcVar4,"pubkey");
        if (iVar3 == 0) {
          oclass = 2;
          goto LAB_0010451e;
        }
        iVar3 = strcmp(pcVar4,"privkey");
        if (iVar3 == 0) {
          oclass = 3;
          goto LAB_0010451e;
        }
        iVar3 = strcmp(pcVar4,"data");
        if (iVar3 == 0) {
          oclass = 0;
          goto LAB_0010451e;
        }
LAB_00104602:
        pPVar10 = tclStubsPtr->tcl_SetObjResult;
        pcVar4 = "pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\"";
      }
      pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(pcVar4,-1);
      goto LAB_001045b7;
    }
    local_1128 = (Tcl_Obj *)attr_find;
LAB_0010452d:
    lVar5 = (**(code **)((long)cd + 0x40))(cd,pTVar6);
    if ((lVar5 != 0) &&
       (handle = *(tclpkcs11_handle **)(lVar5 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
      iVar3 = (*tclStubsPtr->tcl_GetLongFromObj)((Tcl_Interp_conflict *)interp,pTVar8,&slotid_long);
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = tclpkcs11_start_session(handle,slotid_long);
      if (iVar3 == 0) {
        CVar11 = (*handle->pkcs11->C_FindObjectsInit)
                           (handle->session,(CK_ATTRIBUTE_PTR)local_1128,CVar12);
        if (CVar11 == 0) {
          local_1100 = (*tclStubsPtr->tcl_NewObj)();
          do {
            memset(label,0,0x800);
            attr_class[0].ulValueLen = 8;
            attr_label[0].ulValueLen = 0x800;
            attr_ckaid[0].pValue = ckaid;
            attr_ckaid[0].ulValueLen = 0x800;
            attr_label[0].pValue = label;
            attr_class[0].pValue = &oclass;
            CVar11 = (*handle->pkcs11->C_FindObjects)(handle->session,&hObject,1,&ulObjectCount);
            if (CVar11 != 0) {
              pPVar10 = tclStubsPtr->tcl_SetObjResult;
              pTVar6 = tclpkcs11_pkcs11_error(CVar11);
LAB_00104acb:
              (*pPVar10)((Tcl_Interp_conflict *)interp,pTVar6);
              (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
              return 1;
            }
            if (ulObjectCount != 1) {
              if (ulObjectCount == 0) {
                (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,local_1100);
                return 0;
              }
              pPVar10 = tclStubsPtr->tcl_SetObjResult;
              pcVar4 = "FindObjects() returned a weird number of objects.";
LAB_00104a71:
              pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(pcVar4,-1);
              goto LAB_00104acb;
            }
            CVar11 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,hObject,attr_class,1);
            if (CVar11 != 0) {
              pPVar10 = tclStubsPtr->tcl_SetObjResult;
              pcVar4 = "C_GetAttributeValue CKA_CLASS for CKA_OBJECT_CLASS.";
              goto LAB_00104a71;
            }
            CVar11 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,hObject,attr_label,1);
            if (CVar11 != 0) {
              pPVar10 = tclStubsPtr->tcl_SetObjResult;
              pcVar4 = "C_GetAttributeValue CKA_LABEL for CKA_OBJECT_CLASS.";
              goto LAB_00104a71;
            }
            pcVar4 = "CKO_VENDOR_DEFINED";
            if (oclass < 0x80000000) {
              pcVar4 = class_name_rel + *(int *)(class_name_rel + oclass * 4);
            }
            p_Var1 = tclStubsPtr->tcl_NewStringObj;
            sVar7 = strlen(pcVar4);
            local_1128 = (*p_Var1)(pcVar4,(int)sVar7);
            pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("hobj",-1);
            p_Var2 = tclStubsPtr->tcl_AppendObjToObj;
            pTVar8 = tclpkcs11_bytearray_to_string((uchar *)&hObject,8);
            (*p_Var2)(pTVar6,pTVar8);
            pTVar8 = (*tclStubsPtr->tcl_NewStringObj)((char *)label,(int)attr_label[0].ulValueLen);
            if (oclass - 1 < 3) {
              CVar11 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,hObject,attr_ckaid,1);
              if (CVar11 == 0) {
                local_1120 = tclpkcs11_bytearray_to_string(ckaid,attr_ckaid[0].ulValueLen);
                goto LAB_001048ab;
              }
              pPVar10 = tclStubsPtr->tcl_SetObjResult;
              pcVar4 = "C_GetAttributeValue CKA_ID for CKA_OBJECT_CLASS.";
LAB_00104abe:
              pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(pcVar4,-1);
              goto LAB_00104acb;
            }
            local_1120 = (*tclStubsPtr->tcl_NewStringObj)("NONE",-1);
LAB_001048ab:
            if (local_1134 == 5) {
              local_1118.pValue = (uchar *)0x0;
              local_1118.ulValueLen = 0;
              CVar11 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,hObject,&local_1118,1)
              ;
              if (CVar11 != 0) {
                pPVar10 = tclStubsPtr->tcl_SetObjResult;
                pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                                   ("C_GetAttributeValue CKA_VALUE for CKA_OBJECT_CLASS.",-1);
                goto LAB_00104acb;
              }
              local_1118.pValue = (*tclStubsPtr->tcl_Alloc)((uint)local_1118.ulValueLen);
              CVar11 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,hObject,&local_1118,1)
              ;
              if (CVar11 != 0) {
                pPVar10 = tclStubsPtr->tcl_SetObjResult;
                pcVar4 = "C_GetAttributeValue CKA_VALUE 1 for CKA_OBJECT_CLASS.";
                goto LAB_00104abe;
              }
              local_10c0 = tclpkcs11_bytearray_to_string
                                     ((uchar *)local_1118.pValue,local_1118.ulValueLen);
              (*tclStubsPtr->tcl_Free)((char *)local_1118.pValue);
            }
            pTVar9 = (*tclStubsPtr->tcl_NewObj)();
            (*tclStubsPtr->tcl_ListObjAppendElement)
                      ((Tcl_Interp_conflict *)interp,pTVar9,local_1128);
            (*tclStubsPtr->tcl_ListObjAppendElement)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
            (*tclStubsPtr->tcl_ListObjAppendElement)((Tcl_Interp_conflict *)interp,pTVar9,pTVar8);
            if (oclass - 1 < 3) {
              (*tclStubsPtr->tcl_ListObjAppendElement)
                        ((Tcl_Interp_conflict *)interp,pTVar9,local_1120);
            }
            if (local_1134 == 5) {
              (*tclStubsPtr->tcl_ListObjAppendElement)
                        ((Tcl_Interp_conflict *)interp,pTVar9,local_10c0);
            }
            (*tclStubsPtr->tcl_ListObjAppendElement)
                      ((Tcl_Interp_conflict *)interp,local_1100,pTVar9);
          } while( true );
        }
        pPVar10 = tclStubsPtr->tcl_SetObjResult;
      }
      else {
        CVar11 = (CK_RV)iVar3;
        pPVar10 = tclStubsPtr->tcl_SetObjResult;
      }
      pTVar6 = tclpkcs11_pkcs11_error(CVar11);
      goto LAB_001045b7;
    }
    pPVar10 = tclStubsPtr->tcl_SetObjResult;
    pcVar4 = "invalid handle";
  }
LAB_001045ab:
  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(pcVar4,-1);
LAB_001045b7:
  (*pPVar10)((Tcl_Interp_conflict *)interp,pTVar6);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_list_objects(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //    CK_BYTE *value = NULL;
  //    CK_ULONG value_len = 0;

  static CK_BBOOL ltrue = CK_TRUE;
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid;
  long slotid_long;
  Tcl_Obj *obj_hobj, *obj_label, *obj_id, *obj_object, *obj_value;
  //	Tcl_Obj *obj_hobj1;
  Tcl_Obj *ret_list, *curr_item_list;
  int tcl_rv;
  CK_SLOT_ID slotid;
  CK_OBJECT_HANDLE hObject;
  CK_ULONG ulObjectCount;
  //	static CK_OBJECT_CLASS     oclass     = CKO_CERTIFICATE;
  //	                           {CKA_ID, NULL, 0},
  char *objtype = NULL, *objdump = NULL;
  CK_UTF8CHAR label[2048];

  CK_OBJECT_CLASS oclass = 0;
  CK_BYTE ckaid[2048];
  //	CK_BYTE *ckavalue;
  CK_ATTRIBUTE *attr_find_obj;

  CK_ATTRIBUTE attr_find[] = {
    {CKA_TOKEN, &ltrue, sizeof(ltrue)},
  };
  CK_ATTRIBUTE attr_class[] = {
    {CKA_CLASS, NULL, 0},
  };
  CK_ATTRIBUTE attr_label[] = {
    {CKA_LABEL, NULL, 0},
  };
  CK_ATTRIBUTE attr_ckaid[] = {
    {CKA_ID, NULL, 0},
  };
  CK_ATTRIBUTE attr_ckavalue[] = {
    {CKA_VALUE, NULL, 0},
  };
  int count;
  	
  CK_ATTRIBUTE attr_find_class[] = {
    {CKA_TOKEN, &ltrue, sizeof(ltrue)},
    {CKA_CLASS, &oclass, sizeof(oclass)},
  };

  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc < 3 && objc > 5) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];
  count = 1;
  attr_find_obj = attr_find;
  if (objc > 3) {
    count = 2;
    objtype = Tcl_GetString(objv[3]);
    //fprintf(stderr, "LISTOBJECTS objtype=%s\n", objtype);
    if (strcmp(objtype, "all") == 0) {
      attr_find_obj = attr_find;
      count = 1;
    } else if (strcmp(objtype, "cert") == 0) {
      attr_find_obj = attr_find;
      oclass = CKO_CERTIFICATE;
      attr_find_obj = attr_find_class;
    } else if (strcmp(objtype, "pubkey") == 0) {
      attr_find_obj = attr_find;
      oclass = CKO_PUBLIC_KEY;
      attr_find_obj = attr_find_class;
    } else if (strcmp(objtype, "privkey") == 0) {
      attr_find_obj = attr_find;
      oclass = CKO_PRIVATE_KEY;
      attr_find_obj = attr_find_class;
    } else if (strcmp(objtype, "data") == 0) {
      attr_find_obj = attr_find;
      oclass = CKO_DATA;
      attr_find_obj = attr_find_class;
    } else {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\"", -1));
      return(TCL_ERROR);
    }
  }
  if (objc > 4) {
    objdump = Tcl_GetString(objv[4]);
    if (strcmp(objdump, "value") != 0) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("pki::pkcs11::listobjects handle slot [all|privkey|pubkey|cert|data] [value]\"", -1));
      return(TCL_ERROR);
    }
    if (strcmp(objtype, "privkey") == 0 && (strcmp(objdump, "value") == 0)) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("pki::pkcs11::listobjects: cannot value private key\"", -1));
      return(TCL_ERROR);
    }
    if (strcmp(objtype, "all") == 0 && (strcmp(objdump, "value") == 0)) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("pki::pkcs11::listobjects: cannot value private key\"", -1));
      return(TCL_ERROR);
    }
    //fprintf(stderr, "LISTOBJECTS objdump=%s\n", objdump);
  }

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  chk_rv = handle->pkcs11->C_FindObjectsInit(handle->session,  attr_find_obj, count);
  //	chk_rv = handle->pkcs11->C_FindObjectsInit(handle->session,  attr_find_obj, sizeof(attr_find) / sizeof(CK_ATTRIBUTE));
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  ret_list = Tcl_NewObj();
  while (1) {
    char *name = NULL;
    memset(label, 0, sizeof(label));
    attr_class[0].pValue = &oclass;
    attr_class[0].ulValueLen = sizeof(oclass);
    attr_label[0].pValue = label;
    attr_label[0].ulValueLen = sizeof(label);
    attr_ckaid[0].pValue = ckaid;
    attr_ckaid[0].ulValueLen = sizeof(ckaid);


    chk_rv = handle->pkcs11->C_FindObjects(handle->session, &hObject, 1, &ulObjectCount);
    if (chk_rv != CKR_OK) {
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }

    if (ulObjectCount == 0) {
      break;
    }

    if (ulObjectCount != 1) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("FindObjects() returned a weird number of objects.", -1));

      handle->pkcs11->C_FindObjectsFinal(handle->session);

      return(TCL_ERROR);
    }
    //////////////////////
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_class, sizeof(attr_class)/sizeof(CK_ATTRIBUTE));
    if (chk_rv != CKR_OK) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_CLASS for CKA_OBJECT_CLASS.", -1));
      handle->pkcs11->C_FindObjectsFinal(handle->session);
      return(TCL_ERROR);
    }
    chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_label, sizeof(attr_label)/sizeof(CK_ATTRIBUTE));
    if (chk_rv != CKR_OK) {
      Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_LABEL for CKA_OBJECT_CLASS.", -1));
      handle->pkcs11->C_FindObjectsFinal(handle->session);
      return(TCL_ERROR);
    }
    if (oclass >= CKO_VENDOR_DEFINED) {
      name = class_name[7];
    } else {
      name = class_name[oclass];
    }
    obj_object = Tcl_NewStringObj(name, strlen(name));
    		

    obj_hobj = Tcl_NewStringObj("hobj", -1);
    Tcl_AppendObjToObj(obj_hobj, tclpkcs11_bytearray_to_string((const unsigned char *)&hObject, sizeof(CK_OBJECT_HANDLE)));
    /*
    //Восстановление HANDLE объекта в функциях, где они будут задействованы
    objtype = Tcl_GetString(obj_hobj);
    obj_hobj1 = Tcl_NewStringObj(objtype + 4, -1);
    //tcl_strtobytearray_rv
    tclpkcs11_string_to_bytearray(obj_hobj1, (CK_OBJECT_HANDLE*)&hObject, Tcl_GetCharLength(obj_hobj1) / 2);
    */
    //fprintf(stderr, "%s\n", name);
    //fprintf(stderr, "\t label: '%s'\n", label);
    obj_label = Tcl_NewStringObj((const char *)label, attr_label[0].ulValueLen);

    if (oclass == CKO_CERTIFICATE || oclass == CKO_PUBLIC_KEY || oclass == CKO_PRIVATE_KEY) {
      chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_ckaid, sizeof(attr_ckaid)/sizeof(CK_ATTRIBUTE));
      if (chk_rv != CKR_OK) {
        Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_ID for CKA_OBJECT_CLASS.", -1));
        handle->pkcs11->C_FindObjectsFinal(handle->session);
        return(TCL_ERROR);
      }
      // Convert the ID into a readable string
      obj_id = tclpkcs11_bytearray_to_string(ckaid, attr_ckaid[0].ulValueLen);
    } else {
      obj_id = Tcl_NewStringObj("NONE", -1);
    }
    if (objc == 5) {
      attr_ckavalue[0].pValue = NULL;
      attr_ckavalue[0].ulValueLen = 0;
      chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_ckavalue, sizeof(attr_ckavalue)/sizeof(CK_ATTRIBUTE));
      if (chk_rv != CKR_OK) {
        Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_VALUE for CKA_OBJECT_CLASS.", -1));
        handle->pkcs11->C_FindObjectsFinal(handle->session);
        return(TCL_ERROR);
      }
      //fprintf(stderr, "LEN=%i\n", attr_ckavalue[0].ulValueLen);
      attr_ckavalue[0].pValue = ckalloc(attr_ckavalue[0].ulValueLen);
      chk_rv = handle->pkcs11->C_GetAttributeValue(handle->session, hObject, attr_ckavalue, sizeof(attr_ckavalue)/sizeof(CK_ATTRIBUTE));
      if (chk_rv != CKR_OK) {
        Tcl_SetObjResult(interp, Tcl_NewStringObj("C_GetAttributeValue CKA_VALUE 1 for CKA_OBJECT_CLASS.", -1));
        handle->pkcs11->C_FindObjectsFinal(handle->session);
        return(TCL_ERROR);
      }
      obj_value = tclpkcs11_bytearray_to_string(attr_ckavalue[0].pValue, attr_ckavalue[0].ulValueLen);
      ckfree(attr_ckavalue[0].pValue);
    }
    /* Create the current item list */
    curr_item_list = Tcl_NewObj();
    //		Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_object", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_object);

    //		Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("handle_object", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_hobj);

    //		Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_label", -1));
    Tcl_ListObjAppendElement(interp, curr_item_list, obj_label);

    if (oclass == CKO_CERTIFICATE || oclass == CKO_PUBLIC_KEY || oclass == CKO_PRIVATE_KEY) {
      //		    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("pkcs11_id", -1));
      Tcl_ListObjAppendElement(interp, curr_item_list, obj_id);
    }
    if (objc == 5) {
      Tcl_ListObjAppendElement(interp, curr_item_list, obj_value);
    }
    /* Add the current item to the return value list */
    Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);
  }

  /* Terminate search */
  handle->pkcs11->C_FindObjectsFinal(handle->session);

  /* Return */
  Tcl_SetObjResult(interp, ret_list);
  //	Tcl_SetObjResult(interp, curr_item_list);

  return(TCL_OK);
}